

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintSExpression::maybePrintUnreachableReplacement
          (PrintSExpression *this,Expression *curr,Type type)

{
  Index *this_00;
  bool bVar1;
  Iterator IVar2;
  undefined1 local_f0 [8];
  Unreachable unreachable;
  Drop drop;
  Expression *child;
  undefined1 local_b0 [8];
  Iterator __end2;
  undefined1 local_80 [8];
  Iterator __begin2;
  ChildIterator *__range2;
  Expression *local_20;
  Expression *curr_local;
  PrintSExpression *this_local;
  Type type_local;
  
  __range2._4_4_ = 1;
  local_20 = curr;
  curr_local = (Expression *)this;
  this_local = (PrintSExpression *)type.id;
  bVar1 = wasm::Type::operator!=((Type *)&this_local,(BasicType *)((long)&__range2 + 4));
  if (bVar1) {
    visitExpression(this,local_20);
  }
  else {
    std::operator<<(this->o,"(block");
    if ((this->minify & 1U) == 0) {
      std::operator<<(this->o," ;; (replaces something unreachable we can\'t emit)");
    }
    incIndent(this);
    this_00 = &__begin2.index;
    ChildIterator::ChildIterator((ChildIterator *)this_00,local_20);
    IVar2 = AbstractChildIterator<wasm::ChildIterator>::begin
                      ((AbstractChildIterator<wasm::ChildIterator> *)this_00);
    __end2._8_8_ = IVar2.parent;
    __begin2.parent._0_4_ = IVar2.index;
    local_80 = (undefined1  [8])__end2._8_8_;
    IVar2 = AbstractChildIterator<wasm::ChildIterator>::end
                      ((AbstractChildIterator<wasm::ChildIterator> *)this_00);
    local_b0 = (undefined1  [8])IVar2.parent;
    __end2.parent._0_4_ = IVar2.index;
    while( true ) {
      bVar1 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator!=
                        ((Iterator *)local_80,(Iterator *)local_b0);
      if (!bVar1) break;
      AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*((Iterator *)local_80);
      Drop::Drop((Drop *)&unreachable.super_SpecificExpression<(wasm::Expression::Id)23>.
                          super_Expression.type);
      printFullLine(this,(Expression *)
                         &unreachable.super_SpecificExpression<(wasm::Expression::Id)23>.
                          super_Expression.type);
      AbstractChildIterator<wasm::ChildIterator>::Iterator::operator++((Iterator *)local_80);
    }
    ChildIterator::~ChildIterator((ChildIterator *)&__begin2.index);
    Unreachable::Unreachable((Unreachable *)local_f0);
    printFullLine(this,(Expression *)local_f0);
    decIndent(this);
  }
  return;
}

Assistant:

void maybePrintUnreachableReplacement(Expression* curr, Type type) {
    // See the parallel function
    // PrintExpressionContents::printUnreachableReplacement for background. That
    // one handles the header, and this one the body. For convenience, this one
    // also gets a parameter of the type to check for unreachability, to avoid
    // boilerplate in the callers; if the type is not unreachable, it does the
    // normal behavior.
    //
    // Note that the list of instructions using that function must match those
    // using this one, so we print the header and body properly together.

    if (type != Type::unreachable) {
      visitExpression(curr);
      return;
    }

    // Emit a block with drops of the children.
    o << "(block";
    if (!minify) {
      o << " ;; (replaces something unreachable we can't emit)";
    }
    incIndent();
    for (auto* child : ChildIterator(curr)) {
      Drop drop;
      drop.value = child;
      printFullLine(&drop);
    }
    Unreachable unreachable;
    printFullLine(&unreachable);
    decIndent();
  }